

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable_list.h
# Opt level: O2

void __thiscall hittable_list::add(hittable_list *this,shared_ptr<hittable> *object)

{
  aabb local_80;
  aabb local_50;
  
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (&this->objects,object);
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_80);
  aabb::aabb(&local_50,&this->bbox,&local_80);
  (this->bbox).z.min = local_50.z.min;
  (this->bbox).z.max = local_50.z.max;
  (this->bbox).y.min = local_50.y.min;
  (this->bbox).y.max = local_50.y.max;
  (this->bbox).x.min = local_50.x.min;
  (this->bbox).x.max = local_50.x.max;
  return;
}

Assistant:

void add(shared_ptr<hittable> object) {
        objects.push_back(object);
        bbox = aabb(bbox, object->bounding_box());
    }